

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O2

int __thiscall
cpprofiler::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo *paVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 extraout_RAX;
  addrinfo **__pai;
  addrinfo *servinfo;
  addrinfo *local_80;
  string local_78;
  addrinfo local_58;
  
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  std::__cxx11::to_string(&local_78,this->port);
  __pai = &local_80;
  iVar2 = getaddrinfo("localhost",local_78._M_dataplus._M_p,&local_58,__pai);
  std::__cxx11::string::~string((string *)&local_78);
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      this->sockfd = iVar2;
      if (iVar2 != -1) {
        iVar2 = ::connect(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar2 != -1) {
          freeaddrinfo(local_80);
          iVar2 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_00197068;
        }
        close(this->sockfd);
      }
      __pai = &paVar1->ai_next;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar4 = gai_strerror(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\n");
  }
  iVar2 = 0;
LAB_00197068:
  this->_connected = SUB41(iVar2,0);
  return iVar2;
}

Assistant:

void connect() {
    struct addrinfo hints, *servinfo, *p;
    int rv;

#ifdef WIN32
    // Initialise Winsock.
    WSADATA wsaData;
    int startupResult = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (startupResult != 0) {
      printf("WSAStartup failed with error: %d\n", startupResult);
    }
#endif

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo("localhost", std::to_string(port).c_str(), &hints,
                          &servinfo)) != 0) {
      std::cerr << "getaddrinfo: " << gai_strerror(rv) << "\n";
      goto giveup;
    }

    // loop through all the results and connect to the first we can
    for (p = servinfo; p != NULL; p = p->ai_next) {
      if ((sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1) {
        // errno is set here, but we don't examine it.
        continue;
      }

      if (::connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
#ifdef WIN32
        closesocket(sockfd);
#else
        close(sockfd);
#endif
        // errno is set here, but we don't examine it.
        continue;
      }

      break;
    }

    // Connection failed; give up.
    if (p == NULL) {
      goto giveup;
    }

    freeaddrinfo(servinfo);  // all done with this structure

    _connected = true;

    return;
giveup:
    _connected = false;
    return;

  }